

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O2

int __thiscall
vkt::memory::anon_unknown_0::FillBuffer::verify
          (FillBuffer *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen)

{
  ulong *puVar1;
  size_t ndx;
  ulong uVar2;
  byte bVar3;
  
  bVar3 = 0;
  for (uVar2 = 0; uVar2 < this->m_bufferSize; uVar2 = uVar2 + 1) {
    *(char *)(*(long *)(ctx + 0x18) + uVar2) = (char)(this->m_value >> (bVar3 & 0x18));
    puVar1 = (ulong *)(*(long *)(ctx + 0x30) + (uVar2 >> 6) * 8);
    *puVar1 = *puVar1 | 1L << ((byte)uVar2 & 0x3f);
    bVar3 = bVar3 + 8;
  }
  return (int)uVar2;
}

Assistant:

void FillBuffer::verify (VerifyContext& context, size_t)
{
	ReferenceMemory&	reference	= context.getReference();

	for (size_t ndx = 0; ndx < m_bufferSize; ndx++)
	{
#if (DE_ENDIANNESS == DE_LITTLE_ENDIAN)
		reference.set(ndx, (deUint8)(0xffu & (m_value >> (8*(ndx % 4)))));
#else
		reference.set(ndx, (deUint8)(0xffu & (m_value >> (8*(3 - (ndx % 4))))));
#endif
	}
}